

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O0

void __thiscall cmGraphVizWriter::Write(cmGraphVizWriter *this)

{
  cmGeneratorTarget *t;
  bool bVar1;
  LocalGeneratorVector *this_00;
  reference this_01;
  pointer this_02;
  GeneratorTargetVector *this_03;
  pointer this_04;
  string *name;
  reference ppcVar2;
  allocator<char> local_189;
  string local_188;
  allocator<char> local_161;
  string local_160;
  undefined1 local_140 [24];
  cmLinkItem item;
  cmGeneratorTarget *gt_1;
  iterator __end1_1;
  iterator __begin1_1;
  set<const_cmGeneratorTarget_*,_cmGeneratorTarget::StrictTargetComparison,_std::allocator<const_cmGeneratorTarget_*>_>
  *__range1_1;
  pointer local_c0;
  undefined1 local_b8 [8];
  unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *gt;
  const_iterator __end2;
  const_iterator __begin2;
  GeneratorTargetVector *__range2;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *lg;
  const_iterator __end1;
  const_iterator __begin1;
  LocalGeneratorVector *__range1;
  set<const_cmGeneratorTarget_*,_cmGeneratorTarget::StrictTargetComparison,_std::allocator<const_cmGeneratorTarget_*>_>
  sortedGeneratorTargets;
  string local_38 [32];
  cmGlobalGenerator *local_18;
  cmGlobalGenerator *gg;
  cmGraphVizWriter *this_local;
  
  local_18 = this->GlobalGenerator;
  gg = (cmGlobalGenerator *)this;
  (*local_18->_vptr_cmGlobalGenerator[3])();
  (*(this->super_cmLinkItemGraphVisitor)._vptr_cmLinkItemGraphVisitor[2])(this,local_38);
  std::__cxx11::string::~string(local_38);
  std::
  set<const_cmGeneratorTarget_*,_cmGeneratorTarget::StrictTargetComparison,_std::allocator<const_cmGeneratorTarget_*>_>
  ::set((set<const_cmGeneratorTarget_*,_cmGeneratorTarget::StrictTargetComparison,_std::allocator<const_cmGeneratorTarget_*>_>
         *)&__range1);
  this_00 = cmGlobalGenerator::GetLocalGenerators(local_18);
  __end1 = std::
           vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ::begin(this_00);
  lg = (unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)
       std::
       vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
       ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                                *)&lg);
    if (!bVar1) break;
    this_01 = __gnu_cxx::
              __normal_iterator<const_std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
              ::operator*(&__end1);
    this_02 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                        (this_01);
    this_03 = cmLocalGenerator::GetGeneratorTargets(this_02);
    __end2 = std::
             vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
             ::begin(this_03);
    gt = (unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
         std::
         vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
         ::end(this_03);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
                                  *)&gt);
      if (!bVar1) break;
      local_b8 = (undefined1  [8])
                 __gnu_cxx::
                 __normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
                 ::operator*(&__end2);
      this_04 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                operator->((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *
                           )local_b8);
      name = cmGeneratorTarget::GetName_abi_cxx11_(this_04);
      bVar1 = cmGlobalGenerator::IsReservedTarget(name);
      if (!bVar1) {
        local_c0 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::get
                             ((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                               *)local_b8);
        std::
        set<const_cmGeneratorTarget_*,_cmGeneratorTarget::StrictTargetComparison,_std::allocator<const_cmGeneratorTarget_*>_>
        ::insert((set<const_cmGeneratorTarget_*,_cmGeneratorTarget::StrictTargetComparison,_std::allocator<const_cmGeneratorTarget_*>_>
                  *)&__range1,&local_c0);
      }
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::
             set<const_cmGeneratorTarget_*,_cmGeneratorTarget::StrictTargetComparison,_std::allocator<const_cmGeneratorTarget_*>_>
             ::begin((set<const_cmGeneratorTarget_*,_cmGeneratorTarget::StrictTargetComparison,_std::allocator<const_cmGeneratorTarget_*>_>
                      *)&__range1);
  gt_1 = (cmGeneratorTarget *)
         std::
         set<const_cmGeneratorTarget_*,_cmGeneratorTarget::StrictTargetComparison,_std::allocator<const_cmGeneratorTarget_*>_>
         ::end((set<const_cmGeneratorTarget_*,_cmGeneratorTarget::StrictTargetComparison,_std::allocator<const_cmGeneratorTarget_*>_>
                *)&__range1);
  while( true ) {
    bVar1 = std::operator!=(&__end1_1,(_Self *)&gt_1);
    if (!bVar1) break;
    ppcVar2 = std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>::operator*(&__end1_1);
    t = *ppcVar2;
    item.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)t;
    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_140);
    cmLinkItem::cmLinkItem
              ((cmLinkItem *)(local_140 + 0x10),t,false,(cmListFileBacktrace *)local_140);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_140);
    cmLinkItemGraphVisitor::VisitItem
              (&this->super_cmLinkItemGraphVisitor,(cmLinkItem *)(local_140 + 0x10));
    cmLinkItem::~cmLinkItem((cmLinkItem *)(local_140 + 0x10));
    std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>::operator++(&__end1_1);
  }
  if ((this->GeneratePerTarget & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"",&local_161);
    WritePerTargetConnections<(anonymous_namespace)::DependeesDir>
              (this,&this->PerTargetConnections,&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator(&local_161);
  }
  if ((this->GenerateDependers & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,".dependers",&local_189)
    ;
    WritePerTargetConnections<(anonymous_namespace)::DependersDir>
              (this,&this->TargetDependersConnections,&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    std::allocator<char>::~allocator(&local_189);
  }
  std::
  set<const_cmGeneratorTarget_*,_cmGeneratorTarget::StrictTargetComparison,_std::allocator<const_cmGeneratorTarget_*>_>
  ::~set((set<const_cmGeneratorTarget_*,_cmGeneratorTarget::StrictTargetComparison,_std::allocator<const_cmGeneratorTarget_*>_>
          *)&__range1);
  return;
}

Assistant:

void cmGraphVizWriter::Write()
{
  const auto* gg = this->GlobalGenerator;

  this->VisitGraph(gg->GetName());

  // We want to traverse in a determined order, such that the output is always
  // the same for a given project (this makes tests reproducible, etc.)
  std::set<cmGeneratorTarget const*, cmGeneratorTarget::StrictTargetComparison>
    sortedGeneratorTargets;

  for (const auto& lg : gg->GetLocalGenerators()) {
    for (const auto& gt : lg->GetGeneratorTargets()) {
      // Reserved targets have inconsistent names across platforms (e.g. 'all'
      // vs. 'ALL_BUILD'), which can disrupt the traversal ordering.
      // We don't need or want them anyway.
      if (!cmGlobalGenerator::IsReservedTarget(gt->GetName())) {
        sortedGeneratorTargets.insert(gt.get());
      }
    }
  }

  // write global data and collect all connection data for per target graphs
  for (const auto* const gt : sortedGeneratorTargets) {
    auto item = cmLinkItem(gt, false, gt->GetBacktrace());
    this->VisitItem(item);
  }

  if (this->GeneratePerTarget) {
    this->WritePerTargetConnections<DependeesDir>(this->PerTargetConnections);
  }

  if (this->GenerateDependers) {
    this->WritePerTargetConnections<DependersDir>(
      this->TargetDependersConnections, ".dependers");
  }
}